

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O1

Block * Js::CompoundString::Block::New
                  (void *buffer,CharCount usedCharLength,bool reserveMoreSpace,Recycler *recycler)

{
  code *pcVar1;
  undefined8 buffer_00;
  bool bVar2;
  uint size;
  BOOL BVar3;
  CharCount charCapacity;
  undefined4 *puVar4;
  Recycler *this;
  Block *this_00;
  type_info *ptVar5;
  size_t size_00;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  if (buffer == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x4a,"(buffer)","buffer");
    if (!bVar2) goto LAB_00b36fc7;
    *puVar4 = 0;
  }
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x4b,"(recycler)","recycler");
    if (!bVar2) goto LAB_00b36fc7;
    *puVar4 = 0;
  }
  data._32_8_ = buffer;
  size = SizeFromUsedCharLength(usedCharLength);
  if (reserveMoreSpace) {
    size = GrowSize(size);
  }
  ptVar5 = (type_info *)((ulong)size - 0x18);
  local_60 = (undefined1  [8])&typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_6104351;
  data.filename._0_4_ = 0x50;
  data.typeinfo = ptVar5;
  this = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_60);
  BVar3 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) goto LAB_00b36fc7;
    *puVar4 = 0;
  }
  size_00 = 0xffffffffffffffff;
  if (ptVar5 < (type_info *)0xffffffffffffffe8) {
    size_00 = (ulong)size;
  }
  this_00 = (Block *)Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                               (this,size_00);
  buffer_00 = data._32_8_;
  if (this_00 == (Block *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x20d,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) {
LAB_00b36fc7:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  charCapacity = CharCapacityFromSize(size);
  Block(this_00,(void *)buffer_00,usedCharLength,charCapacity);
  return this_00;
}

Assistant:

CompoundString::Block *CompoundString::Block::New(
        const void *const buffer,
        const CharCount usedCharLength,
        const bool reserveMoreSpace,
        Recycler *const recycler)
    {
        Assert(buffer);
        Assert(recycler);

        uint size = SizeFromUsedCharLength(usedCharLength);
        if(reserveMoreSpace)
            size = GrowSize(size);
        return RecyclerNewPlus(recycler, size - sizeof(Block), Block, buffer, usedCharLength, CharCapacityFromSize(size));
    }